

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::anon_unknown_2::
         LegacyFullClassName<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *desc,Options *options)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_60 [8];
  string php_namespace;
  string classname;
  Options *options_local;
  Descriptor *desc_local;
  
  LegacyGeneratedClassName<google::protobuf::Descriptor>
            ((string *)((long)&php_namespace.field_2 + 8),desc);
  RootPhpNamespace<google::protobuf::Descriptor>((string *)local_60,desc,options);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   "\\");
    std::operator+(__return_storage_ptr__,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&php_namespace.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(php_namespace.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(php_namespace.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string LegacyFullClassName(const DescriptorType* desc,
                                const Options& options) {
  std::string classname = LegacyGeneratedClassName(desc);
  std::string php_namespace = RootPhpNamespace(desc, options);
  if (!php_namespace.empty()) {
    return php_namespace + "\\" + classname;
  }
  return classname;
}